

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

string * chaiscript::exception::load_module_error::format_error
                   (string *__return_storage_ptr__,string *t_name,
                   vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
                   *t_errors)

{
  vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
  *this;
  bool bVar1;
  ostream *poVar2;
  reference plVar3;
  char *pcVar4;
  load_module_error *err;
  const_iterator __end2;
  const_iterator __begin2;
  vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
  *__range2;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
  *local_20;
  vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
  *t_errors_local;
  string *t_name_local;
  
  local_20 = t_errors;
  t_errors_local =
       (vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
        *)t_name;
  t_name_local = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar2 = std::operator<<(local_198,"Error loading module \'");
  poVar2 = std::operator<<(poVar2,(string *)t_errors_local);
  poVar2 = std::operator<<(poVar2,"\'\n");
  std::operator<<(poVar2,"  The following locations were searched:\n");
  this = local_20;
  __end2 = Catch::clara::std::
           vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
           ::begin(local_20);
  err = (load_module_error *)
        Catch::clara::std::
        vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
        ::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_chaiscript::exception::load_module_error_*,_std::vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>_>
                      (&__end2,(__normal_iterator<const_chaiscript::exception::load_module_error_*,_std::vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>_>
                                *)&err);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    plVar3 = __gnu_cxx::
             __normal_iterator<const_chaiscript::exception::load_module_error_*,_std::vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>_>
             ::operator*(&__end2);
    poVar2 = std::operator<<(local_198,"    ");
    pcVar4 = (char *)(**(code **)(*(long *)plVar3 + 0x10))();
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::operator<<(poVar2,"\n");
    __gnu_cxx::
    __normal_iterator<const_chaiscript::exception::load_module_error_*,_std::vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static std::string format_error(const std::string &t_name, const std::vector<load_module_error> &t_errors) {
        std::stringstream ss;
        ss << "Error loading module '" << t_name << "'\n"
           << "  The following locations were searched:\n";

        for (const auto &err : t_errors) {
          ss << "    " << err.what() << "\n";
        }

        return ss.str();
      }